

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O1

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Float_(ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
         *this)

{
  Position *this_00;
  int *piVar1;
  int iVar2;
  byte *pbVar3;
  bool bVar4;
  
  pbVar3 = (byte *)(this->m_position).m_pos;
  if ((pbVar3 != (byte *)(this->m_position).m_end) &&
     (m_alphabet._M_elems[3]._M_elems[*pbVar3] == true)) {
    pbVar3 = (byte *)(this->m_position).m_pos;
    bVar4 = pbVar3 == (byte *)(this->m_position).m_end;
    if (!bVar4) {
      this_00 = &this->m_position;
      do {
        if (m_alphabet._M_elems[2]._M_elems[*pbVar3] != true) {
          if (bVar4) {
            return false;
          }
          iVar2 = tolower((int)(char)*pbVar3);
          if (iVar2 != 0x65) {
            if (*pbVar3 != 0x2e) {
              return false;
            }
            Position::operator++(this_00);
            pbVar3 = (byte *)(this->m_position).m_pos;
            if ((pbVar3 == (byte *)(this->m_position).m_end) ||
               (m_alphabet._M_elems[2]._M_elems[*pbVar3] != true)) {
              (this->m_position).m_pos = (char *)(pbVar3 + -1);
              if (pbVar3[-1] == 10) {
                (this->m_position).line = (this->m_position).line + -1;
                (this->m_position).col = (this->m_position).m_last_col;
                return false;
              }
              piVar1 = &(this->m_position).col;
              *piVar1 = *piVar1 + -1;
              return false;
            }
            while ((pbVar3 = (byte *)(this->m_position).m_pos,
                   pbVar3 != (byte *)(this->m_position).m_end &&
                   (m_alphabet._M_elems[2]._M_elems[*pbVar3] == true))) {
              Position::operator++(this_00);
            }
          }
          bVar4 = read_exponent_and_suffix(this);
          return bVar4;
        }
        Position::operator++(this_00);
        pbVar3 = (byte *)(this->m_position).m_pos;
        bVar4 = pbVar3 == (byte *)(this->m_position).m_end;
      } while (!bVar4);
    }
  }
  return false;
}

Assistant:

constexpr bool has_more() const noexcept { return m_pos != m_end; }